

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O1

vector<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_> * __thiscall
TextBuffer::Layer::find_words_with_subsequence_in_range
          (vector<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>
           *__return_storage_ptr__,Layer *this,u16string *query,u16string *extra_word_characters,
          Range range)

{
  pointer pcVar1;
  iterator __position;
  pointer puVar2;
  pointer pSVar3;
  pointer pSVar4;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar5;
  pointer pSVar6;
  wint_t wVar7;
  int iVar8;
  vector<Point,std::allocator<Point>> *this_00;
  Point PVar9;
  iterator iVar10;
  pointer pSVar11;
  ulong uVar12;
  ulong uVar13;
  __node_base _Var14;
  value_type *__x;
  SubsequenceMatchVariant *pSVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  value_type *pvVar19;
  iterator __position_00;
  const_iterator __position_01;
  initializer_list<TextBuffer::Layer::SubsequenceMatchVariant> __l;
  ClipResult CVar20;
  ClipResult CVar21;
  vector<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_> *matches;
  SubsequenceMatchVariant new_match;
  Point current_word_start;
  vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
  new_match_variants;
  vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
  match_variants;
  size_t query_index;
  pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>
  entry;
  u16string current_word;
  u16string raw_query;
  Point position;
  unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>_>
  substring_matches;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  local_198;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  local_188;
  _Hashtable<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_178;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_170;
  int local_158;
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *local_148;
  Point local_140;
  Point local_138;
  uint local_12c;
  vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
  local_128;
  vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
  local_108;
  size_t local_f0;
  pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>
  local_e8;
  u16string local_b0;
  long *local_90 [2];
  long local_80 [2];
  Point local_70;
  _Hashtable<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_140 = range.end;
  local_f0 = 0;
  Point::Point(&local_70);
  Point::Point(&local_138);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = L'\0';
  local_90[0] = local_80;
  pcVar1 = (query->_M_dataplus)._M_p;
  std::__cxx11::u16string::_M_construct<char16_t*>
            ((u16string *)local_90,pcVar1,pcVar1 + query->_M_string_length);
  uVar17 = query->_M_string_length;
  if (uVar17 < 0x51) {
    local_148 = (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
                 *)extra_word_characters;
    if (uVar17 != 0) {
      pcVar1 = (query->_M_dataplus)._M_p;
      lVar18 = 0;
      do {
        wVar7 = towlower((uint)*(ushort *)((long)pcVar1 + lVar18));
        *(short *)((long)pcVar1 + lVar18) = (short)wVar7;
        lVar18 = lVar18 + 2;
      } while (uVar17 * 2 != lVar18);
    }
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    CVar20 = clip_position(this,range.start,false);
    CVar21 = clip_position(this,local_140,false);
    local_1a8._0_8_ = local_148;
    local_1a8._8_8_ = &local_b0;
    local_198._M_allocated_capacity = (size_type)&local_138;
    local_198._8_8_ = &local_70;
    local_188._M_allocated_capacity = (size_type)&local_f0;
    local_178 = &local_68;
    local_188._8_8_ = query;
    for_each_chunk_in_range<TextBuffer::Layer::find_words_with_subsequence_in_range(std::__cxx11::u16string,std::__cxx11::u16string_const&,Range)::_lambda(TextSlice)_1_>
              (this,CVar20.position,CVar21.position,(anon_class_56_7_63254529 *)local_1a8,false);
    if (((local_b0._M_string_length != 0) && (local_b0._M_string_length < 0x51)) &&
       (local_f0 == query->_M_string_length)) {
      this_00 = (vector<Point,std::allocator<Point>> *)
                std::__detail::
                _Map_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&local_68,&local_b0);
      __position._M_current = *(Point **)(this_00 + 8);
      if (__position._M_current == *(Point **)(this_00 + 0x10)) {
        std::vector<Point,std::allocator<Point>>::_M_realloc_insert<Point_const&>
                  (this_00,__position,&local_138);
      }
      else {
        *__position._M_current = local_138;
        *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
      }
    }
    (__return_storage_ptr__->
    super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>)
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>)
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>)
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)local_68._M_before_begin._M_nxt !=
        (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
         *)0x0) {
      _Var14._M_nxt = local_68._M_before_begin._M_nxt;
      do {
        std::
        pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>
        ::pair(&local_e8,
               (pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>
                *)((long)_Var14._M_nxt + 8));
        local_198._M_allocated_capacity = 0;
        local_198._8_8_ = (Point *)0x0;
        local_1a8._0_8_ = (u16string *)0x0;
        local_1a8._8_8_ = (u16string *)0x0;
        local_188._M_allocated_capacity = local_188._M_allocated_capacity & 0xffffffffffff0000;
        __l._M_len = 1;
        __l._M_array = (iterator)local_1a8;
        std::
        vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
        ::vector(&local_108,__l,(allocator_type *)&local_128);
        local_148 = (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
                     *)_Var14._M_nxt;
        if ((u16string *)local_1a8._8_8_ != (u16string *)0x0) {
          operator_delete((void *)local_1a8._8_8_,local_198._8_8_ - local_1a8._8_8_);
        }
        local_128.
        super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
        ._M_impl.super__Vector_impl_data._M_start = (value_type *)0x0;
        local_128.
        super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
        ._M_impl.super__Vector_impl_data._M_finish = (value_type *)0x0;
        local_128.
        super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (local_e8.first._M_string_length != 0) {
          uVar17 = 0;
          do {
            wVar7 = towlower((uint)(ushort)local_e8.first._M_dataplus._M_p[uVar17]);
            __x = local_128.
                  super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                  ._M_impl.super__Vector_impl_data._M_start;
            pvVar19 = local_128.
                      super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (local_108.
                super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                local_108.
                super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              local_140 = (Point)(uVar17 - 1);
              __position_00._M_current =
                   local_108.
                   super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              do {
                if ((__position_00._M_current)->query_index < query->_M_string_length) {
                  if ((query->_M_dataplus)._M_p[(__position_00._M_current)->query_index] ==
                      (char16_t)wVar7) {
                    local_1a8._0_8_ = (__position_00._M_current)->query_index;
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               (local_1a8 + 8),&(__position_00._M_current)->match_indices);
                    local_1a8._0_8_ = local_1a8._0_8_ + 1;
                    local_188._M_local_buf[0] = (__position_00._M_current)->score;
                    if (((uVar17 == 0) ||
                        (iVar8 = iswalnum((uint)(ushort)local_e8.first._M_dataplus._M_p[uVar17 - 1])
                        , iVar8 == 0)) ||
                       ((iVar8 = iswlower((uint)(ushort)local_e8.first._M_dataplus._M_p[uVar17 - 1])
                        , iVar8 != 0 &&
                        (iVar8 = iswupper((uint)(ushort)local_e8.first._M_dataplus._M_p[uVar17]),
                        iVar8 != 0)))) {
                      local_188._M_local_buf[0] =
                           (ushort)(local_e8.first._M_dataplus._M_p[uVar17] ==
                                   *(char16_t *)
                                    ((long)local_90[0] + (__position_00._M_current)->query_index * 2
                                    )) + local_188._M_local_buf[0] + 9;
                    }
                    if ((local_1a8._8_8_ != local_198._M_allocated_capacity) &&
                       (PVar9.column = 0, PVar9.row = *(uint *)(local_198._M_allocated_capacity - 4)
                       , local_140 == PVar9)) {
                      local_188._M_local_buf[0] = local_188._M_local_buf[0] + L'\x05';
                    }
                    local_12c = (uint)uVar17;
                    if (local_198._M_allocated_capacity == local_198._8_8_) {
                      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                      _M_realloc_insert<unsigned_int>
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                 (local_1a8 + 8),(iterator)local_198._M_allocated_capacity,
                                 &local_12c);
                    }
                    else {
                      *(uint *)local_198._M_allocated_capacity = local_12c;
                      local_198._M_allocated_capacity = local_198._M_allocated_capacity + 4;
                    }
                    std::
                    vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                    ::push_back(&local_128,(value_type *)local_1a8);
                    if ((u16string *)local_1a8._8_8_ != (u16string *)0x0) {
                      operator_delete((void *)local_1a8._8_8_,local_198._8_8_ - local_1a8._8_8_);
                    }
                  }
                  (__position_00._M_current)->score =
                       (__position_00._M_current)->score + ((uVar17 < 3) - 1 | 0xfffd);
                  iVar10._M_current = __position_00._M_current + 1;
                  if ((iVar10._M_current !=
                       local_108.
                       super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                       ._M_impl.super__Vector_impl_data._M_finish) &&
                     (__position_00._M_current[1].query_index ==
                      (__position_00._M_current)->query_index)) {
                    iVar10 = std::
                             vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                             ::_M_erase(&local_108,__position_00);
                  }
                }
                else {
                  iVar10._M_current = __position_00._M_current + 1;
                }
                __x = local_128.
                      super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                      ._M_impl.super__Vector_impl_data._M_start;
                __position_00._M_current = iVar10._M_current;
                pvVar19 = local_128.
                          super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              } while (iVar10._M_current !=
                       local_108.
                       super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            }
            for (; pSVar6 = local_128.
                            super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                pSVar11 = local_128.
                          super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                          ._M_impl.super__Vector_impl_data._M_start, __x != pvVar19; __x = __x + 1)
            {
              __position_01._M_current =
                   local_108.
                   super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              if (0 < (long)local_108.
                            super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_108.
                            super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                            ._M_impl.super__Vector_impl_data._M_start) {
                uVar16 = ((ulong)((long)local_108.
                                        super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_108.
                                       super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                         -0x3333333333333333;
                do {
                  uVar12 = uVar16 >> 1;
                  uVar13 = uVar12;
                  if (__position_01._M_current[uVar12].query_index < __x->query_index) {
                    uVar13 = ~uVar12 + uVar16;
                    __position_01._M_current = __position_01._M_current + uVar12 + 1;
                  }
                  uVar16 = uVar13;
                } while (0 < (long)uVar13);
              }
              if (((__position_01._M_current ==
                    local_108.
                    super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                    ._M_impl.super__Vector_impl_data._M_finish) ||
                  (__x->query_index != (__position_01._M_current)->query_index)) ||
                 (__x->score < (__position_01._M_current)->score)) {
                std::
                vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                ::insert(&local_108,__position_01,__x);
              }
              else {
                (__position_01._M_current)->query_index = __x->query_index;
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                          (&(__position_01._M_current)->match_indices,&__x->match_indices);
                (__position_01._M_current)->score = __x->score;
              }
            }
            pvVar19 = local_128.
                      super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if (local_128.
                super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_128.
                super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              do {
                puVar2 = (pvVar19->match_indices).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if (puVar2 != (pointer)0x0) {
                  operator_delete(puVar2,(long)(pvVar19->match_indices).
                                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                         (long)puVar2);
                }
                pvVar19 = pvVar19 + 1;
              } while (pvVar19 != pSVar6);
              local_128.
              super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
              ._M_impl.super__Vector_impl_data._M_finish = pSVar11;
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 < local_e8.first._M_string_length);
        }
        if (local_108.
            super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_108.
            super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pSVar15 = (SubsequenceMatchVariant *)0x0;
        }
        else {
          pSVar15 = (SubsequenceMatchVariant *)0x0;
          pSVar11 = local_108.
                    super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            if ((pSVar11->query_index == query->_M_string_length) &&
               ((pSVar15 == (SubsequenceMatchVariant *)0x0 || (pSVar15->score < pSVar11->score)))) {
              pSVar15 = pSVar11;
            }
            pSVar11 = pSVar11 + 1;
          } while (pSVar11 !=
                   local_108.
                   super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        local_1a8._0_8_ = &local_198;
        std::__cxx11::u16string::_M_construct<char16_t*>
                  ((u16string *)local_1a8,local_e8.first._M_dataplus._M_p,
                   local_e8.first._M_dataplus._M_p + local_e8.first._M_string_length);
        std::vector<Point,_std::allocator<Point>_>::vector
                  ((vector<Point,_std::allocator<Point>_> *)&local_188,&local_e8.second);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&local_170,&pSVar15->match_indices);
        local_158 = (int)pSVar15->score;
        std::vector<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>::
        emplace_back<TextBuffer::SubsequenceMatch>
                  (__return_storage_ptr__,(SubsequenceMatch *)local_1a8);
        paVar5 = local_148;
        if (local_170.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_170.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_170.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_170.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((size_t *)local_188._M_allocated_capacity != (size_t *)0x0) {
          operator_delete((void *)local_188._M_allocated_capacity,(long)local_178 - local_188._0_8_)
          ;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
             *)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198._M_allocated_capacity * 2 + 2);
        }
        std::
        vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
        ::~vector(&local_128);
        std::
        vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
        ::~vector(&local_108);
        if (local_e8.second.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_e8.second.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_e8.second.super__Vector_base<Point,_std::allocator<Point>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_e8.second.super__Vector_base<Point,_std::allocator<Point>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
             *)local_e8.first._M_dataplus._M_p != &local_e8.first.field_2) {
          operator_delete(local_e8.first._M_dataplus._M_p,
                          local_e8.first.field_2._M_allocated_capacity * 2 + 2);
        }
        _Var14._M_nxt = (_Hash_node_base *)paVar5->_M_allocated_capacity;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
                *)_Var14._M_nxt !=
               (anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
                *)0x0);
    }
    pSVar3 = (__return_storage_ptr__->
             super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pSVar4 = (__return_storage_ptr__->
             super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar3 != pSVar4) {
      uVar17 = ((long)pSVar4 - (long)pSVar3 >> 3) * 0x2e8ba2e8ba2e8ba3;
      lVar18 = 0x3f;
      if (uVar17 != 0) {
        for (; uVar17 >> lVar18 == 0; lVar18 = lVar18 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<TextBuffer::SubsequenceMatch*,std::vector<TextBuffer::SubsequenceMatch,std::allocator<TextBuffer::SubsequenceMatch>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<TextBuffer::Layer::find_words_with_subsequence_in_range(std::__cxx11::u16string,std::__cxx11::u16string_const&,Range)::_lambda(TextBuffer::SubsequenceMatch_const&,TextBuffer::SubsequenceMatch_const&)_1_>>
                (pSVar3,pSVar4,((uint)lVar18 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<TextBuffer::SubsequenceMatch*,std::vector<TextBuffer::SubsequenceMatch,std::allocator<TextBuffer::SubsequenceMatch>>>,__gnu_cxx::__ops::_Iter_comp_iter<TextBuffer::Layer::find_words_with_subsequence_in_range(std::__cxx11::u16string,std::__cxx11::u16string_const&,Range)::_lambda(TextBuffer::SubsequenceMatch_const&,TextBuffer::SubsequenceMatch_const&)_1_>>
                (pSVar3,pSVar4);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_68);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>)
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>)
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>)
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] * 2 + 2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT62(local_b0.field_2._M_allocated_capacity._2_6_,
                             local_b0.field_2._M_local_buf[0]) * 2 + 2);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<SubsequenceMatch> find_words_with_subsequence_in_range(u16string query, const u16string &extra_word_characters, Range range) {
    const size_t MAX_WORD_LENGTH = 80;
    size_t query_index = 0;
    Point position;
    Point current_word_start;
    u16string current_word;
    u16string raw_query = query;

    if (query.size() > MAX_WORD_LENGTH) return vector<SubsequenceMatch>{};

    std::transform(query.begin(), query.end(), query.begin(), std::towlower);

    // First, find the start position of all words matching the given
    // subsequence.
    std::unordered_map<u16string, vector<Point>> substring_matches;

    for_each_chunk_in_range(
      clip_position(range.start).position,
      clip_position(range.end).position,
      [&] (TextSlice chunk) -> bool {
        for (uint16_t c : chunk) {
          bool is_word_character =
            std::iswalnum(c) ||
            std::find(extra_word_characters.begin(), extra_word_characters.end(), c) != extra_word_characters.end();

          if (is_word_character) {
            if (current_word.empty()) current_word_start = position;
            current_word += c;
            if (query_index < query.size() && towlower(c) == query[query_index]) {
              query_index++;
            }
          } else {
            if (!current_word.empty()) {
              if (query_index == query.size() && current_word.size() <= MAX_WORD_LENGTH) {
                substring_matches[current_word].push_back(current_word_start);
              }
              query_index = 0;
              current_word.clear();
            }
          }

          if (c == '\n') {
            position.row++;
            position.column = 0;
          } else {
            position.column++;
          }
        }

        return false;
      });

    if (!current_word.empty() && query_index == query.size() && current_word.size() <= MAX_WORD_LENGTH) {
      substring_matches[current_word].push_back(current_word_start);
    }

    // Next, calculate a score for each word indicating the quality of the
    // match against the query.

    static const unsigned consecutive_bonus = 5;
    static const unsigned subword_start_with_case_match_bonus = 10;
    static const unsigned subword_start_with_case_mismatch_bonus = 9;
    static const unsigned mismatch_penalty = 1;
    static const unsigned leading_mismatch_penalty = 3;

    vector<SubsequenceMatch> matches;

    for (auto entry : substring_matches) {
      const u16string &word = entry.first;
      const vector<Point> &start_positions = entry.second;

      vector<SubsequenceMatchVariant> match_variants {{}};
      vector<SubsequenceMatchVariant> new_match_variants;

      for (size_t i = 0; i < word.size(); i++) {
        uint16_t c = towlower(word[i]);

        for (auto match_variant = match_variants.begin(); match_variant != match_variants.end();) {
          if (match_variant->query_index < query.size()) {
            // If the current word character matches the next character of
            // the query for this match variant, create a *new* match variant
            // that consumes the matching character.
            if (c == query[match_variant->query_index]) {
              SubsequenceMatchVariant new_match = *match_variant;
              new_match.query_index++;

              if (i == 0 ||
                  !std::iswalnum(word[i - 1]) ||
                  (std::iswlower(word[i - 1]) && std::iswupper(word[i]))) {
                new_match.score += word[i] == raw_query[match_variant->query_index]
                  ? subword_start_with_case_match_bonus
                  : subword_start_with_case_mismatch_bonus;
              }

              if (!new_match.match_indices.empty() && new_match.match_indices.back() == i - 1) {
                new_match.score += consecutive_bonus;
              }

              new_match.match_indices.push_back(i);
              new_match_variants.push_back(new_match);
            }

            // For the current match variant, treat the current character as
            // a mismatch regardless of whether it matched above. This
            // reserves the chance for the next character to be consumed by a
            // match with higher overall value.
            if (i < 3) {
              match_variant->score -= leading_mismatch_penalty;
            } else {
              match_variant->score -= mismatch_penalty;
            }

            // If a match variant does *not* match the current character (and is therefore
            // ineligible for the consecutive match bonus on the next character), its
            // potential for future scoring is determined entirely by its `query_index`.
            //
            // These match variants are ordered by ascending `query_index`. If multiple
            // match variants have the same `query_index`, they are ordered by ascending
            // `score`.
            //
            // If there is another match variant with the same `query_index` and a greater
            // or equal `score`, discard the current match variant.
            auto next_match_variant = match_variant + 1;
            if (next_match_variant != match_variants.end() && next_match_variant->query_index == match_variant->query_index) {
              match_variant = match_variants.erase(match_variant);
            } else {
              ++match_variant;
            }
          } else {
            ++match_variant;
          }
        }

        // Add all of the newly-computed match variants to the list. Avoid creating duplicate
        // match variants with the same query index unless the new variant (which is
        // by definition eligible for the consecutive match bonus on the next character) has
        // a lower score than an existing variant. Maintain the invariant that match variants
        // are ordered by ascending `query_index` and ascending `score`.
        for (const SubsequenceMatchVariant &new_variant : new_match_variants) {
          auto existing_match_iter = std::lower_bound(match_variants.begin(), match_variants.end(), new_variant);
          if (existing_match_iter != match_variants.end() && new_variant.query_index == existing_match_iter->query_index) {
            if (new_variant.score >= existing_match_iter->score) {
              *existing_match_iter = new_variant;
              continue;
            }
          }
          match_variants.insert(existing_match_iter, new_variant);
        }
        new_match_variants.clear();
      }

      SubsequenceMatchVariant *best_match = nullptr;
      for (auto &match_variant : match_variants) {
        if (match_variant.query_index == query.size()) {
          if (!best_match || best_match->score < match_variant.score) {
            best_match = &match_variant;
          }
        }
      }

      matches.push_back(SubsequenceMatch{word, start_positions, best_match->match_indices, best_match->score});
    }

    std::sort(matches.begin(), matches.end(), [] (const SubsequenceMatch &a, const SubsequenceMatch &b) {
      // Doing it this way helps us avoid sorting ambiguity keeping the ordering the same across platforms.
      if (a.score > b.score) return true;
      if (b.score > a.score) return false;
      return a.word < b.word;
    });

    return matches;
  }